

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O2

uint RDL_bitset_init(uchar **compressed,uint size)

{
  uchar *puVar1;
  uint uVar2;
  
  uVar2 = ((size >> 3) + 1) - (uint)((size & 7) == 0);
  puVar1 = (uchar *)calloc(1,(ulong)uVar2);
  *compressed = puVar1;
  return uVar2;
}

Assistant:

unsigned RDL_bitset_init(unsigned char** compressed, unsigned size)
{
  unsigned new_size;

  new_size = size / BlockSize;
  if (size % BlockSize) {
    ++new_size;
  }

  *compressed = malloc(new_size * sizeof(**compressed));
  memset(*compressed, 0, new_size * sizeof(**compressed));

  return new_size;
}